

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O3

void cvui::render::rect(cvui_block_t *theBlock,Rect *thePos,uint theBorderColor,uint theFillingColor
                       )

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  Scalar aFilling;
  Scalar aBorder;
  Rect aClippedRect;
  Mat aOverlay;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  _InputArray local_1e0;
  _InputArray local_1c8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  undefined4 local_158 [2];
  cvui_block_t *local_150;
  undefined8 local_148;
  _OutputArray local_f8;
  Mat local_e0 [96];
  Mat local_80 [96];
  
  local_1b0 = (double)(theBorderColor & 0xff);
  local_1a8 = (double)(theBorderColor >> 8 & 0xff);
  local_1a0 = (double)(theBorderColor >> 0x10 & 0xff);
  local_198 = (double)(theBorderColor >> 0x18);
  local_200 = (double)(theFillingColor & 0xff);
  local_1f8 = (double)(theFillingColor >> 8 & 0xff);
  local_1f0 = (double)(theFillingColor >> 0x10 & 0xff);
  dVar4 = (double)(theFillingColor >> 0x18);
  local_1e8 = dVar4;
  if (theFillingColor >> 0x18 != 0xff) {
    if (theFillingColor < 0x1000000) {
      local_148 = 0;
      local_158[0] = 0x3010000;
      local_168 = thePos->x;
      iStack_164 = thePos->y;
      iStack_160 = thePos->width;
      iStack_15c = thePos->height;
      local_150 = theBlock;
      cv::rectangle(local_158,&local_168,&local_200,0xffffffff,0x10,0);
    }
    else {
      iVar1 = **(int **)&theBlock->field_0x40;
      iVar3 = thePos->x;
      local_18c = thePos->y;
      local_188 = 0;
      if (0 < iVar3) {
        local_188 = iVar3;
      }
      local_184 = 0;
      if (0 < local_18c) {
        local_184 = local_18c;
      }
      iVar2 = (*(int **)&theBlock->field_0x40)[1];
      iVar3 = iVar3 + thePos->width;
      if (iVar2 < iVar3) {
        iVar3 = iVar2;
      }
      local_18c = local_18c + thePos->height;
      if (iVar1 < local_18c) {
        local_18c = iVar1;
      }
      local_190 = iVar3 - local_188;
      if ((local_190 == 0 || iVar3 < local_188) ||
         (local_18c = local_18c - local_184, local_18c < 1)) {
        local_188 = 0;
        local_184 = 0;
        local_190 = 0;
        local_18c = 0;
      }
      local_180 = local_190;
      local_17c = local_18c;
      cv::Mat::Mat((Mat *)local_158,&local_190,*(uint *)theBlock & 0xfff,&local_200);
      local_1c8.sz.width = 0;
      local_1c8.sz.height = 0;
      local_1c8.flags = 0x1010000;
      local_1c8.obj = (Mat *)local_158;
      cv::Mat::Mat(local_80,&theBlock->where,(Rect_ *)&local_188);
      local_1e0.sz.width = 0;
      local_1e0.sz.height = 0;
      local_1e0.flags = 0x1010000;
      local_1e0.obj = local_80;
      cv::Mat::Mat(local_e0,&theBlock->where,(Rect_ *)&local_188);
      dVar4 = dVar4 / -255.0 + 1.0;
      local_f8.super__InputArray.sz.width = 0;
      local_f8.super__InputArray.sz.height = 0;
      local_f8.super__InputArray.flags = -0x3dff0000;
      local_f8.super__InputArray.obj = local_e0;
      cv::addWeighted(&local_1c8,dVar4,&local_1e0,1.0 - dVar4,0.0,&local_f8,-1);
      cv::Mat::~Mat(local_e0);
      cv::Mat::~Mat(local_80);
      cv::Mat::~Mat((Mat *)local_158);
    }
  }
  local_148 = 0;
  local_158[0] = 0x3010000;
  local_178 = thePos->x;
  iStack_174 = thePos->y;
  iStack_170 = thePos->width;
  iStack_16c = thePos->height;
  local_150 = theBlock;
  cv::rectangle(local_158,&local_178,&local_1b0,1,0x10,0);
  return;
}

Assistant:

void rect(cvui_block_t& theBlock, cv::Rect& thePos, unsigned int theBorderColor, unsigned int theFillingColor) {
		cv::Scalar aBorder = internal::hexToScalar(theBorderColor);
		cv::Scalar aFilling = internal::hexToScalar(theFillingColor);

		bool aHasFilling = aFilling[3] != 0xff;

		if (aHasFilling) {
			if (aFilling[3] == 0x00) {
				// full opacity
				cv::rectangle(theBlock.where, thePos, aFilling, CVUI_FILLED, CVUI_ANTIALISED);
			} else {
				cv::Rect aClippedRect = thePos & cv::Rect(cv::Point(0, 0), theBlock.where.size());
				double aAlpha = 1.00 - static_cast<double>(aFilling[3]) / 255;
				cv::Mat aOverlay(aClippedRect.size(), theBlock.where.type(), aFilling);
				cv::addWeighted(aOverlay, aAlpha, theBlock.where(aClippedRect), 1.00 - aAlpha, 0.0, theBlock.where(aClippedRect));
			}
		}

		// Render the border
		cv::rectangle(theBlock.where, thePos, aBorder, 1, CVUI_ANTIALISED);
	}